

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::LineRenderCase::printLineWidthError
          (LineRenderCase *this,IVec2 *pos,int detectedLineWidth,IVec2 *lineWidthRange,
          bool isHorizontal,int *messageLimitCounter)

{
  int iVar1;
  TestLog *this_00;
  MessageBuilder *pMVar2;
  int local_1d8;
  int local_1d4;
  char *local_1d0 [3];
  MessageBuilder local_1b8;
  int *local_38;
  int *messageLimitCounter_local;
  IVec2 *pIStack_28;
  bool isHorizontal_local;
  IVec2 *lineWidthRange_local;
  IVec2 *pIStack_18;
  int detectedLineWidth_local;
  IVec2 *pos_local;
  LineRenderCase *this_local;
  
  iVar1 = *messageLimitCounter;
  *messageLimitCounter = iVar1 + -1;
  if (-1 < iVar1 + -1) {
    local_38 = messageLimitCounter;
    messageLimitCounter_local._7_1_ = isHorizontal;
    pIStack_28 = lineWidthRange;
    lineWidthRange_local._4_4_ = detectedLineWidth;
    pIStack_18 = pos;
    pos_local = (IVec2 *)this;
    this_00 = tcu::TestContext::getLog
                        ((this->super_BBoxRenderCase).super_TestCase.super_TestCase.super_TestNode.
                         m_testCtx);
    tcu::TestLog::operator<<(&local_1b8,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar2 = tcu::MessageBuilder::operator<<
                       (&local_1b8,(char (*) [33])"Found incorrect line width near ");
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,pIStack_18);
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [4])0x2bef10c);
    local_1d0[0] = "uni_atom_vertical";
    if ((messageLimitCounter_local._7_1_ & 1) != 0) {
      local_1d0[0] = "uni_atom_horizontal";
    }
    local_1d0[0] = local_1d0[0] + 9;
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,local_1d0);
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [8])" line)\n");
    pMVar2 = tcu::MessageBuilder::operator<<
                       (pMVar2,(char (*) [32])"\tExpected line width in range [");
    local_1d4 = tcu::Vector<int,_2>::x(pIStack_28);
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_1d4);
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [3])0x2a4b1eb);
    local_1d8 = tcu::Vector<int,_2>::y(pIStack_28);
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_1d8);
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [13])"] but found ");
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(int *)((long)&lineWidthRange_local + 4));
    tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1b8);
  }
  return;
}

Assistant:

void LineRenderCase::printLineWidthError (const tcu::IVec2& pos, int detectedLineWidth, const tcu::IVec2& lineWidthRange, bool isHorizontal, int& messageLimitCounter) const
{
	if (--messageLimitCounter < 0)
		return;

	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Found incorrect line width near " << pos << ": (" << ((isHorizontal) ? ("horizontal") : ("vertical")) << " line)\n"
			<< "\tExpected line width in range [" << lineWidthRange.x() << ", " << lineWidthRange.y() << "] but found " << detectedLineWidth
		<< tcu::TestLog::EndMessage;
}